

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O2

string * __thiscall
tinyusdz::fmt::format<char[5],std::__cxx11::string>
          (string *__return_storage_ptr__,fmt *this,string *in,char (*args) [5],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  value_type *sv;
  error_type *__rhs;
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  ostringstream ss;
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  eStack_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [11];
  
  detail::tokenize(&eStack_1e8,(string *)this);
  if (eStack_1e8.contained.
      super_storage_t_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == false) {
    ::std::operator+(&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     "(format error: ");
    __rhs = nonstd::expected_lite::
            expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::error(&eStack_1e8);
    ::std::operator+(local_1a0,&local_1c0,__rhs);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,local_1a0,")");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    sv = nonstd::expected_lite::
         expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&eStack_1e8);
    detail::format_sv<char[5],std::__cxx11::string>
              ((ostringstream *)local_1a0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)sv,(char (*) [5])in,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  nonstd::expected_lite::
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected(&eStack_1e8);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string &in, Args const &...args) {
  auto ret = detail::tokenize(in);
  if (!ret) {
    return in + "(format error: " + ret.error() + ")";
  }

  std::ostringstream ss;
  detail::format_sv(ss, (*ret), args...);

  return ss.str();
}